

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O2

bool __thiscall
burst::
subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
::equal(subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
        *this,subsequence_iterator<std::_List_const_iterator<int>,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
              *that)

{
  __normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
  __first1;
  __normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>
  __first2;
  bool bVar1;
  
  if ((this->m_begin)._M_node != (that->m_begin)._M_node) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                  ,0x83,
                  "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
                 );
  }
  if ((this->m_end)._M_node == (that->m_end)._M_node) {
    __first1._M_current =
         (this->m_subsequence).
         super__Vector_base<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __first2._M_current =
         (that->m_subsequence).
         super__Vector_base<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = std::
            __equal4<__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>,__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>>
                      (__first1,__first1._M_current + this->m_subsequence_size,__first2,
                       __first2._M_current + that->m_subsequence_size);
    return bVar1;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                ,0x84,
                "bool burst::subsequence_iterator<std::_List_const_iterator<int>>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = std::_List_const_iterator<int>, SubsequenceContainer = std::vector<std::_List_const_iterator<int>>]"
               );
}

Assistant:

bool equal (const subsequence_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subsequence_begin(), this->subsequence_end(),
                    that.subsequence_begin(), that.subsequence_end()
                );
        }